

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

void __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::ClearStackOnExit::~ClearStackOnExit(ClearStackOnExit *this)

{
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *pGVar1;
  
  pGVar1 = this->d_;
  (pGVar1->stack_).stackTop_ = (pGVar1->stack_).stack_;
  internal::Stack<rapidjson::CrtAllocator>::ShrinkToFit(&pGVar1->stack_);
  return;
}

Assistant:

~ClearStackOnExit() { d_.ClearStack(); }